

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ValueRangeExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ValueRangeExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  ValueRangeExpressionSyntax *pVVar16;
  
  pVVar16 = (ValueRangeExpressionSyntax *)allocate(this,0x58,8);
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar12 = args_4->kind;
  uVar13 = args_4->field_0x2;
  NVar14.raw = (args_4->numFlags).raw;
  uVar15 = args_4->rawLen;
  pIVar3 = args_4->info;
  (pVVar16->super_ExpressionSyntax).super_SyntaxNode.kind = ValueRangeExpression;
  (pVVar16->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pVVar16->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pVVar16->openBracket).kind = TVar4;
  (pVVar16->openBracket).field_0x2 = uVar5;
  (pVVar16->openBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pVVar16->openBracket).rawLen = uVar7;
  (pVVar16->openBracket).info = pIVar1;
  (pVVar16->left).ptr = args_1;
  (pVVar16->op).kind = TVar8;
  (pVVar16->op).field_0x2 = uVar9;
  (pVVar16->op).numFlags = (NumericTokenFlags)NVar10.raw;
  (pVVar16->op).rawLen = uVar11;
  (pVVar16->op).info = pIVar2;
  (pVVar16->right).ptr = args_3;
  (pVVar16->closeBracket).kind = TVar12;
  (pVVar16->closeBracket).field_0x2 = uVar13;
  (pVVar16->closeBracket).numFlags = (NumericTokenFlags)NVar14.raw;
  (pVVar16->closeBracket).rawLen = uVar15;
  (pVVar16->closeBracket).info = pIVar3;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pVVar16;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pVVar16;
  return pVVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }